

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

double expected_separation_depth(size_t n)

{
  double dVar1;
  
  if (n < 0xb) {
    return *(double *)(&DAT_00328c30 + n * 8);
  }
  if (0x15675 < n) {
    return 3.0;
  }
  dVar1 = expected_separation_depth_hotstart(2.14268078,10,n);
  return dVar1;
}

Assistant:

double expected_separation_depth(size_t n)
{
    switch(n)
    {
        case 0: return 0.;
        case 1: return 0.;
        case 2: return 1.;
        case 3: return 1. + (1./3.);
        case 4: return 1. + (1./3.) + (2./9.);
        case 5: return 1.71666666667;
        case 6: return 1.84;
        case 7: return 1.93809524;
        case 8: return 2.01836735;
        case 9: return 2.08551587;
        case 10: return 2.14268078;
        default:
        {
            if (n >= THRESHOLD_EXACT_S)
                return 3;
            else
                return expected_separation_depth_hotstart((double)2.14268078, (size_t)10, n);
        }
    }
}